

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void remove_obj_fallen_wings(CHAR_DATA *ch,OBJ_DATA *obj)

{
  bool bVar1;
  int sn;
  void *in_RSI;
  CHAR_DATA *in_RDI;
  int sn_fly;
  CHAR_DATA *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  
  sn = skill_lookup((char *)in_RDI);
  bVar1 = is_affected(in_RDI,sn);
  if (bVar1) {
    act((char *)unaff_retaddr,in_RDI,in_RSI,(void *)CONCAT44(sn,in_stack_ffffffffffffffe8),0);
    send_to_char((char *)unaff_retaddr,in_RDI);
    affect_strip(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void remove_obj_fallen_wings(CHAR_DATA *ch, OBJ_DATA *obj)
{
	int sn_fly = skill_lookup("fly");

	if (!is_affected(ch, sn_fly))
		return;

	act("$n slowly floats back to the ground.", ch, 0, 0, TO_ROOM);
	send_to_char("Your feet slowly float back to the ground.\n\r", ch);
	affect_strip(ch, sn_fly);
}